

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

Plausibility __thiscall
capnp::compiler::CompilerMain::isPlausiblyFlat
          (CompilerMain *this,ArrayPtr<const_unsigned_char> prefix,uint segmentCount)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  uint16_t uVar8;
  uint uVar9;
  size_t sVar10;
  byte *pbVar11;
  uchar *puVar12;
  Reader local_98;
  undefined1 local_68 [8];
  Reader structSchema;
  uint pointers;
  uint data;
  uint32_t segmentId;
  uint segmentCount_local;
  CompilerMain *this_local;
  ArrayPtr<const_unsigned_char> prefix_local;
  
  prefix_local.ptr = (uchar *)prefix.size_;
  this_local = (CompilerMain *)prefix.ptr;
  sVar10 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
  if (sVar10 < 8) {
    prefix_local.size_._4_4_ = PLAUSIBLE;
  }
  else {
    pbVar11 = kj::ArrayPtr<const_unsigned_char>::operator[]
                        ((ArrayPtr<const_unsigned_char> *)&this_local,0);
    if ((*pbVar11 & 3) == 2) {
      puVar12 = kj::ArrayPtr<const_unsigned_char>::operator[]
                          ((ArrayPtr<const_unsigned_char> *)&this_local,4);
      uVar1 = *puVar12;
      puVar12 = kj::ArrayPtr<const_unsigned_char>::operator[]
                          ((ArrayPtr<const_unsigned_char> *)&this_local,5);
      uVar2 = *puVar12;
      puVar12 = kj::ArrayPtr<const_unsigned_char>::operator[]
                          ((ArrayPtr<const_unsigned_char> *)&this_local,6);
      uVar3 = *puVar12;
      puVar12 = kj::ArrayPtr<const_unsigned_char>::operator[]
                          ((ArrayPtr<const_unsigned_char> *)&this_local,7);
      uVar9 = CONCAT13(*puVar12,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
      if ((uVar9 == 0) || (segmentCount <= uVar9)) {
        prefix_local.size_._4_4_ = IMPOSSIBLE;
      }
      else {
        prefix_local.size_._4_4_ = PLAUSIBLE;
      }
    }
    else {
      pbVar11 = kj::ArrayPtr<const_unsigned_char>::operator[]
                          ((ArrayPtr<const_unsigned_char> *)&this_local,0);
      if ((*pbVar11 & 3) == 0) {
        pbVar11 = kj::ArrayPtr<const_unsigned_char>::operator[]
                            ((ArrayPtr<const_unsigned_char> *)&this_local,3);
        if (((*pbVar11 & 0x80) == 0) ||
           (((((puVar12 = kj::ArrayPtr<const_unsigned_char>::operator[]
                                    ((ArrayPtr<const_unsigned_char> *)&this_local,0),
               *puVar12 == 0xff &&
               (puVar12 = kj::ArrayPtr<const_unsigned_char>::operator[]
                                    ((ArrayPtr<const_unsigned_char> *)&this_local,1),
               *puVar12 == 0xff)) &&
              (puVar12 = kj::ArrayPtr<const_unsigned_char>::operator[]
                                   ((ArrayPtr<const_unsigned_char> *)&this_local,2),
              *puVar12 == 0xff)) &&
             ((puVar12 = kj::ArrayPtr<const_unsigned_char>::operator[]
                                   ((ArrayPtr<const_unsigned_char> *)&this_local,3),
              *puVar12 == 0xff &&
              (puVar12 = kj::ArrayPtr<const_unsigned_char>::operator[]
                                   ((ArrayPtr<const_unsigned_char> *)&this_local,4),
              *puVar12 == '\0')))) &&
            ((puVar12 = kj::ArrayPtr<const_unsigned_char>::operator[]
                                  ((ArrayPtr<const_unsigned_char> *)&this_local,5), *puVar12 == '\0'
             && ((puVar12 = kj::ArrayPtr<const_unsigned_char>::operator[]
                                      ((ArrayPtr<const_unsigned_char> *)&this_local,6),
                 *puVar12 == '\0' &&
                 (puVar12 = kj::ArrayPtr<const_unsigned_char>::operator[]
                                      ((ArrayPtr<const_unsigned_char> *)&this_local,7),
                 *puVar12 == '\0')))))))) {
          pbVar11 = kj::ArrayPtr<const_unsigned_char>::operator[]
                              ((ArrayPtr<const_unsigned_char> *)&this_local,3);
          if ((*pbVar11 & 0xe0) == 0) {
            puVar12 = kj::ArrayPtr<const_unsigned_char>::operator[]
                                ((ArrayPtr<const_unsigned_char> *)&this_local,4);
            uVar1 = *puVar12;
            puVar12 = kj::ArrayPtr<const_unsigned_char>::operator[]
                                ((ArrayPtr<const_unsigned_char> *)&this_local,5);
            structSchema._reader._44_4_ = ZEXT24(CONCAT11(*puVar12,uVar1));
            puVar12 = kj::ArrayPtr<const_unsigned_char>::operator[]
                                ((ArrayPtr<const_unsigned_char> *)&this_local,6);
            uVar1 = *puVar12;
            puVar12 = kj::ArrayPtr<const_unsigned_char>::operator[]
                                ((ArrayPtr<const_unsigned_char> *)&this_local,7);
            structSchema._reader.nestingLimit = (int)CONCAT11(*puVar12,uVar1);
            if ((uint)(structSchema._reader._44_4_ + structSchema._reader.nestingLimit) < 0x801) {
              Schema::getProto(&local_98,&(this->rootType).super_Schema);
              capnp::schema::Node::Reader::getStruct((Reader *)local_68,&local_98);
              uVar6 = structSchema._reader._44_4_;
              uVar8 = capnp::schema::Node::Struct::Reader::getDataWordCount((Reader *)local_68);
              iVar4 = structSchema._reader.nestingLimit;
              if ((((uint)uVar6 < (uint)uVar8) &&
                  (uVar8 = capnp::schema::Node::Struct::Reader::getPointerCount((Reader *)local_68),
                  (uint)uVar8 < (uint)iVar4)) ||
                 ((uVar6 = structSchema._reader._44_4_,
                  uVar8 = capnp::schema::Node::Struct::Reader::getDataWordCount((Reader *)local_68),
                  iVar4 = structSchema._reader.nestingLimit, (uint)uVar8 < (uint)uVar6 &&
                  (uVar8 = capnp::schema::Node::Struct::Reader::getPointerCount((Reader *)local_68),
                  (uint)iVar4 < (uint)uVar8)))) {
                prefix_local.size_._4_4_ = WRONG_TYPE;
              }
              else {
                uVar6 = structSchema._reader._44_4_;
                uVar8 = capnp::schema::Node::Struct::Reader::getDataWordCount((Reader *)local_68);
                uVar7 = structSchema._reader._44_4_;
                if (((uint)uVar8 < (uint)uVar6) &&
                   (uVar8 = capnp::schema::Node::Struct::Reader::getDataWordCount
                                      ((Reader *)local_68), 0x80 < uVar7 - (uint)uVar8)) {
                  prefix_local.size_._4_4_ = WRONG_TYPE;
                }
                else {
                  iVar4 = structSchema._reader.nestingLimit;
                  uVar8 = capnp::schema::Node::Struct::Reader::getPointerCount((Reader *)local_68);
                  iVar5 = structSchema._reader.nestingLimit;
                  if (((uint)uVar8 < (uint)iVar4) &&
                     (uVar8 = capnp::schema::Node::Struct::Reader::getPointerCount
                                        ((Reader *)local_68), 0x80 < iVar5 - (uint)uVar8)) {
                    prefix_local.size_._4_4_ = WRONG_TYPE;
                  }
                  else {
                    prefix_local.size_._4_4_ = PLAUSIBLE;
                  }
                }
              }
            }
            else {
              prefix_local.size_._4_4_ = IMPLAUSIBLE;
            }
          }
          else {
            prefix_local.size_._4_4_ = IMPLAUSIBLE;
          }
        }
        else {
          prefix_local.size_._4_4_ = IMPOSSIBLE;
        }
      }
      else {
        prefix_local.size_._4_4_ = IMPOSSIBLE;
      }
    }
  }
  return prefix_local.size_._4_4_;
}

Assistant:

Plausibility isPlausiblyFlat(kj::ArrayPtr<const byte> prefix, uint segmentCount = 1) {
    if (prefix.size() < 8) {
      // Not enough prefix to say.
      return PLAUSIBLE;
    }

    if ((prefix[0] & 3) == 2) {
      // Far pointer.  Verify the segment ID.
      uint32_t segmentId = prefix[4] | (prefix[5] << 8)
                         | (prefix[6] << 16) | (prefix[7] << 24);
      if (segmentId == 0 || segmentId >= segmentCount) {
        return IMPOSSIBLE;
      } else {
        return PLAUSIBLE;
      }
    }

    if ((prefix[0] & 3) != 0) {
      // Not a struct pointer.
      return IMPOSSIBLE;
    }
    if ((prefix[3] & 0x80) != 0) {
      if (prefix[0] == 0xff && prefix[1] == 0xff && prefix[2] == 0xff && prefix[3] == 0xff &&
          prefix[4] == 0    && prefix[5] == 0    && prefix[6] == 0    && prefix[7] == 0) {
        // This is an empty struct with offset of -1. That's valid.
      } else {
        // Offset is negative (invalid).
        return IMPOSSIBLE;
      }
    }
    if ((prefix[3] & 0xe0) != 0) {
      // Offset is over a gigabyte (implausible).
      return IMPLAUSIBLE;
    }

    uint data = prefix[4] | (prefix[5] << 8);
    uint pointers = prefix[6] | (prefix[7] << 8);

    if (data + pointers > 2048) {
      // Root struct is huge (over 16 KiB).
      return IMPLAUSIBLE;
    }

    auto structSchema = rootType.getProto().getStruct();
    if ((data < structSchema.getDataWordCount() && pointers > structSchema.getPointerCount()) ||
        (data > structSchema.getDataWordCount() && pointers < structSchema.getPointerCount())) {
      // Struct is neither older nor newer than the schema.
      return WRONG_TYPE;
    }

    if (data > structSchema.getDataWordCount() &&
        data - structSchema.getDataWordCount() > 128) {
      // Data section appears to have grown by 1k (128 words).  This seems implausible.
      return WRONG_TYPE;
    }
    if (pointers > structSchema.getPointerCount() &&
        pointers - structSchema.getPointerCount() > 128) {
      // Pointer section appears to have grown by 1k (128 words).  This seems implausible.
      return WRONG_TYPE;
    }

    return PLAUSIBLE;
  }